

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O0

void __thiscall
amrex::ParmParse::getarr
          (ParmParse *this,char *name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *ptr,int start_ix,int num_val)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  long in_RDI;
  undefined8 uVar1;
  string *name_00;
  Table *in_stack_ffffffffffffff88;
  allocator<char> local_61;
  string local_60 [24];
  string *in_stack_ffffffffffffffb8;
  ParmParse *in_stack_ffffffffffffffc0;
  
  uVar1 = *(undefined8 *)(in_RDI + 0x50);
  name_00 = (string *)&local_61;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,(char *)in_RSI,(allocator *)name_00);
  prefixedName(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  (anonymous_namespace)::(anonymous_namespace)::sgetarr<std::__cxx11::string>
            (in_stack_ffffffffffffff88,name_00,in_RSI,(int)((ulong)uVar1 >> 0x20),(int)uVar1,
             (int)((ulong)in_RDI >> 0x20));
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  return;
}

Assistant:

void
ParmParse::getarr (const char*     name,
                   std::vector<std::string>& ptr,
                   int             start_ix,
                   int             num_val) const
{
    sgetarr(m_table, prefixedName(name),ptr,start_ix,num_val, LAST);
}